

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void predicate_suite::test_none_of(void)

{
  bool bVar1;
  reference piVar2;
  reference piVar3;
  circular_view<int,_18446744073709551615UL> *pcVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  initializer_list<int> input;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  basic_iterator<int> local_88;
  basic_iterator<int> local_78;
  basic_iterator<int> local_68;
  type local_58 [4];
  circular_view<int,_18446744073709551615UL> local_48;
  
  local_48.member.data = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_48.member.cap = 4;
  local_48.member.size = 0;
  local_48.member.next = 4;
  local_78.parent = (view_pointer)0x160000000b;
  local_78.current = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_78;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_48,input);
  uVar6 = local_48.member.cap * 2;
  if ((uVar6 & local_48.member.cap * 2 - 1) == 0) {
    local_88.current = local_48.member.next - local_48.member.size & uVar6 - 1;
    uVar6 = uVar6 - 1 & local_48.member.next;
  }
  else {
    local_88.current = (local_48.member.next - local_48.member.size) % uVar6;
    uVar6 = local_48.member.next % uVar6;
  }
  lVar5 = (long)(uVar6 - local_88.current) >> 2;
  local_88.parent = &local_48;
  local_68.parent = &local_48;
  local_68.current = uVar6;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      local_78.parent = local_88.parent;
      local_78.current = local_88.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      pcVar4 = local_88.parent;
      uVar7 = local_88.current;
      if (*piVar2 == 0xb) goto LAB_00105056;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      local_78.parent = local_88.parent;
      local_78.current = local_88.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      pcVar4 = local_88.parent;
      uVar7 = local_88.current;
      if (*piVar2 == 0xb) goto LAB_00105056;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      local_78.parent = local_88.parent;
      local_78.current = local_88.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      pcVar4 = local_88.parent;
      uVar7 = local_88.current;
      if (*piVar2 == 0xb) goto LAB_00105056;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      local_78.parent = local_88.parent;
      local_78.current = local_88.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      pcVar4 = local_88.parent;
      uVar7 = local_88.current;
      if (*piVar2 == 0xb) goto LAB_00105056;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = uVar6 - local_88.current;
  if (lVar5 == 1) {
LAB_0010502f:
    local_78.parent = local_88.parent;
    local_78.current = local_88.current;
    piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_78);
    pcVar4 = local_88.parent;
    uVar7 = local_88.current;
    if (*piVar2 != 0xb) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      pcVar4 = &local_48;
      uVar7 = uVar6;
    }
  }
  else if (lVar5 == 2) {
LAB_00105006:
    local_78.parent = local_88.parent;
    local_78.current = local_88.current;
    piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_78);
    pcVar4 = local_88.parent;
    uVar7 = local_88.current;
    if (*piVar2 != 0xb) {
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      goto LAB_0010502f;
    }
  }
  else {
    pcVar4 = &local_48;
    uVar7 = uVar6;
    if (lVar5 == 3) {
      local_78.parent = local_88.parent;
      local_78.current = local_88.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      pcVar4 = local_88.parent;
      uVar7 = local_88.current;
      if (*piVar2 != 0xb) {
        vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                  (&local_88);
        goto LAB_00105006;
      }
    }
  }
LAB_00105056:
  local_78.parent = pcVar4;
  local_78.current = uVar7;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_68,&local_78);
  boost::detail::test_impl
            ("!std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1bb,"void predicate_suite::test_none_of()",!bVar1);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_48,1);
  piVar3 = vista::circular_view<int,_18446744073709551615UL>::back(&local_48);
  *piVar3 = 0x37;
  uVar6 = local_48.member.cap * 2;
  if ((uVar6 & local_48.member.cap * 2 - 1) == 0) {
    local_88.current = local_48.member.next - local_48.member.size & uVar6 - 1;
    uVar6 = uVar6 - 1 & local_48.member.next;
  }
  else {
    local_88.current = (local_48.member.next - local_48.member.size) % uVar6;
    uVar6 = local_48.member.next % uVar6;
  }
  lVar5 = (long)(uVar6 - local_88.current) >> 2;
  local_88.parent = &local_48;
  local_68.parent = &local_48;
  local_68.current = uVar6;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      local_78.parent = local_88.parent;
      local_78.current = local_88.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      pcVar4 = local_88.parent;
      uVar7 = local_88.current;
      if (*piVar2 == 0xb) goto LAB_00105249;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      local_78.parent = local_88.parent;
      local_78.current = local_88.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      pcVar4 = local_88.parent;
      uVar7 = local_88.current;
      if (*piVar2 == 0xb) goto LAB_00105249;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      local_78.parent = local_88.parent;
      local_78.current = local_88.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      pcVar4 = local_88.parent;
      uVar7 = local_88.current;
      if (*piVar2 == 0xb) goto LAB_00105249;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      local_78.parent = local_88.parent;
      local_78.current = local_88.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      pcVar4 = local_88.parent;
      uVar7 = local_88.current;
      if (*piVar2 == 0xb) goto LAB_00105249;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = uVar6 - local_88.current;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pcVar4 = &local_48;
      uVar7 = uVar6;
      if (lVar5 != 3) goto LAB_00105249;
      local_78.parent = local_88.parent;
      local_78.current = local_88.current;
      piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                         (&local_78);
      pcVar4 = local_88.parent;
      uVar7 = local_88.current;
      if (*piVar2 == 0xb) goto LAB_00105249;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
    }
    local_78.parent = local_88.parent;
    local_78.current = local_88.current;
    piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                       (&local_78);
    pcVar4 = local_88.parent;
    uVar7 = local_88.current;
    if (*piVar2 == 0xb) goto LAB_00105249;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
  }
  local_78.parent = local_88.parent;
  local_78.current = local_88.current;
  piVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     (&local_78);
  pcVar4 = local_88.parent;
  uVar7 = local_88.current;
  if (*piVar2 != 0xb) {
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++(&local_88);
    pcVar4 = &local_48;
    uVar7 = uVar6;
  }
LAB_00105249:
  local_78.parent = pcVar4;
  local_78.current = uVar7;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    (&local_68,&local_78);
  boost::detail::test_impl
            ("std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; })",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x1bd,"void predicate_suite::test_none_of()",bVar1);
  return;
}

Assistant:

void test_none_of()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    BOOST_TEST(!std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
    span.push_back(55);
    BOOST_TEST(std::none_of(span.begin(), span.end(), [] (int current) { return current == 11; }));
}